

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-poll-multiple-handles.c
# Opt level: O2

int run_test_poll_multiple_handles(void)

{
  int iVar1;
  int iVar2;
  undefined8 uVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  int64_t eval_b_1;
  int64_t eval_b_2;
  uv_poll_t second_poll_handle;
  uv_poll_t first_poll_handle;
  
  iVar1 = socket(2,1,0);
  first_poll_handle.data = (void *)(long)iVar1;
  second_poll_handle.data = (void *)0xffffffffffffffff;
  if (first_poll_handle.data == (void *)0xffffffffffffffff) {
    pcVar5 = "!=";
    pcVar6 = "-1";
    pcVar4 = "sock";
    uVar3 = 0x3e;
    eval_b_2 = -1;
    pcVar7 = "!=";
    eval_b_1 = -1;
  }
  else {
    uVar3 = uv_default_loop();
    iVar2 = uv_poll_init(uVar3,&first_poll_handle,iVar1);
    eval_b_1 = (int64_t)iVar2;
    second_poll_handle.data = (void *)eval_b_1;
    if ((void *)eval_b_1 == (void *)0x0) {
      uVar3 = uv_default_loop();
      iVar1 = uv_poll_init(uVar3,&second_poll_handle,iVar1);
      eval_b_1 = (int64_t)iVar1;
      eval_b_2 = 0;
      if (eval_b_1 == 0) {
        iVar1 = uv_poll_start(&first_poll_handle,1,poll_cb);
        eval_b_1 = (int64_t)iVar1;
        eval_b_2 = 0;
        if (eval_b_1 == 0) {
          iVar1 = uv_poll_start(&second_poll_handle,1,poll_cb);
          eval_b_1 = (int64_t)iVar1;
          eval_b_2 = -0x11;
          if (eval_b_1 == -0x11) {
            iVar1 = uv_poll_stop(&first_poll_handle);
            eval_b_1 = (int64_t)iVar1;
            eval_b_2 = 0;
            if (eval_b_1 == 0) {
              iVar1 = uv_poll_start(&second_poll_handle,1,poll_cb);
              eval_b_1 = (int64_t)iVar1;
              eval_b_2 = 0;
              if (eval_b_1 == 0) {
                uv_close(&first_poll_handle,close_cb);
                uv_unref(&second_poll_handle);
                uVar3 = uv_default_loop();
                iVar1 = uv_run(uVar3,0);
                eval_b_1 = (int64_t)iVar1;
                eval_b_2 = 0;
                if (eval_b_1 == 0) {
                  eval_b_1 = 1;
                  eval_b_2 = (int64_t)close_cb_called;
                  if (eval_b_2 == 1) {
                    uv_ref(&second_poll_handle);
                    iVar1 = uv_is_active(&second_poll_handle);
                    if (iVar1 == 0) {
                      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-poll-multiple-handles.c"
                              ,0x5c,"uv_is_active((uv_handle_t*) &second_poll_handle)");
                      abort();
                    }
                    uv_close(&second_poll_handle,close_cb);
                    uVar3 = uv_default_loop();
                    iVar1 = uv_run(uVar3,0);
                    eval_b_1 = (int64_t)iVar1;
                    eval_b_2 = 0;
                    if (eval_b_1 == 0) {
                      eval_b_1 = 2;
                      eval_b_2 = (int64_t)close_cb_called;
                      if (eval_b_2 == 2) {
                        uVar3 = uv_default_loop();
                        uv_walk(uVar3,close_walk_cb,0);
                        uv_run(uVar3,0);
                        eval_b_1 = 0;
                        uVar3 = uv_default_loop();
                        iVar1 = uv_loop_close(uVar3);
                        eval_b_2 = (int64_t)iVar1;
                        if (eval_b_2 == 0) {
                          uv_library_shutdown();
                          return 0;
                        }
                        pcVar6 = "uv_loop_close(uv_default_loop())";
                        pcVar4 = "0";
                        uVar3 = 0x62;
                      }
                      else {
                        pcVar6 = "close_cb_called";
                        pcVar4 = "2";
                        uVar3 = 0x60;
                      }
                    }
                    else {
                      pcVar6 = "0";
                      pcVar4 = "uv_run(uv_default_loop(), UV_RUN_DEFAULT)";
                      uVar3 = 0x5f;
                    }
                  }
                  else {
                    pcVar6 = "close_cb_called";
                    pcVar4 = "1";
                    uVar3 = 0x59;
                  }
                }
                else {
                  pcVar6 = "0";
                  pcVar4 = "uv_run(uv_default_loop(), UV_RUN_DEFAULT)";
                  uVar3 = 0x58;
                }
              }
              else {
                pcVar6 = "0";
                pcVar4 = "uv_poll_start(&second_poll_handle, UV_READABLE, poll_cb)";
                uVar3 = 0x52;
              }
            }
            else {
              pcVar6 = "0";
              pcVar4 = "uv_poll_stop(&first_poll_handle)";
              uVar3 = 0x51;
            }
          }
          else {
            pcVar6 = "UV_EEXIST";
            pcVar4 = "uv_poll_start(&second_poll_handle, UV_READABLE, poll_cb)";
            uVar3 = 0x4d;
          }
        }
        else {
          pcVar6 = "0";
          pcVar4 = "uv_poll_start(&first_poll_handle, UV_READABLE, poll_cb)";
          uVar3 = 0x43;
        }
      }
      else {
        pcVar6 = "0";
        pcVar4 = "uv_poll_init(uv_default_loop(), &second_poll_handle, sock)";
        uVar3 = 0x41;
      }
      pcVar5 = "==";
      pcVar7 = "==";
    }
    else {
      pcVar5 = "==";
      pcVar6 = "0";
      pcVar4 = "uv_poll_init(uv_default_loop(), &first_poll_handle, sock)";
      uVar3 = 0x40;
      eval_b_2 = 0;
      pcVar7 = "==";
    }
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-poll-multiple-handles.c"
          ,uVar3,pcVar4,pcVar5,pcVar6,eval_b_1,pcVar7,eval_b_2);
  abort();
}

Assistant:

TEST_IMPL(poll_multiple_handles) {
  uv_os_sock_t sock;
  uv_poll_t first_poll_handle, second_poll_handle;

#ifdef _WIN32
  {
    struct WSAData wsa_data;
    int r = WSAStartup(MAKEWORD(2, 2), &wsa_data);
    ASSERT_OK(r);
  }
#endif

  sock = socket(AF_INET, SOCK_STREAM, 0);
#ifdef _WIN32
  ASSERT_NE(sock, INVALID_SOCKET);
#else
  ASSERT_NE(sock, -1);
#endif
  ASSERT_OK(uv_poll_init(uv_default_loop(), &first_poll_handle, sock));
  ASSERT_OK(uv_poll_init(uv_default_loop(), &second_poll_handle, sock));

  ASSERT_OK(uv_poll_start(&first_poll_handle, UV_READABLE, poll_cb));

  /* We may not start polling while another polling handle is active
   * on that fd.
   */
#ifndef _WIN32
  /* We do not track handles in an O(1) lookupable way on Windows,
   * so not checking that here.
   */
  ASSERT_EQ(uv_poll_start(&second_poll_handle, UV_READABLE, poll_cb),
            UV_EEXIST);
#endif

  /* After stopping the other polling handle, we now should be able to poll */
  ASSERT_OK(uv_poll_stop(&first_poll_handle));
  ASSERT_OK(uv_poll_start(&second_poll_handle, UV_READABLE, poll_cb));

  /* Closing an already stopped polling handle is safe in any case */
  uv_close((uv_handle_t*) &first_poll_handle, close_cb);

  uv_unref((uv_handle_t*) &second_poll_handle);
  ASSERT_OK(uv_run(uv_default_loop(), UV_RUN_DEFAULT));
  ASSERT_EQ(1, close_cb_called);
  uv_ref((uv_handle_t*) &second_poll_handle);

  ASSERT(uv_is_active((uv_handle_t*) &second_poll_handle));
  uv_close((uv_handle_t*) &second_poll_handle, close_cb);

  ASSERT_OK(uv_run(uv_default_loop(), UV_RUN_DEFAULT));
  ASSERT_EQ(2, close_cb_called);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}